

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b52ba8::ObmcSadHBDTest_ExtremeValues_Test::TestBody
          (ObmcSadHBDTest_ExtremeValues_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  int i;
  long lVar3;
  SEARCH_METHODS *message;
  int iVar4;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  AssertHelper AStack_28098;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_28090;
  uint uStack_28088;
  uint uStack_28084;
  internal aiStack_28080 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uStack_28078;
  undefined2 uStack_28070;
  undefined2 auStack_28060 [16384];
  int aiStack_20060 [16384];
  int aiStack_10060 [16396];
  
  iVar4 = 0;
  while( true ) {
    if (iVar4 == 0x80) {
      return;
    }
    bVar2 = testing::Test::HasFatalFailure();
    if (bVar2) break;
    for (lVar3 = 0; lVar3 != 0x4000; lVar3 = lVar3 + 1) {
      auStack_28060[lVar3] = 0xfff;
      aiStack_10060[lVar3] = 0xfff000;
      aiStack_20060[lVar3] = 0x1000;
    }
    uStack_28084 = (*(this->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.ref_func)
                             ((uchar *)((ulong)auStack_28060 >> 1),iVar4,aiStack_10060,aiStack_20060
                             );
    aiStack_28080[0] = SUB21(in_FPUControlWord,0);
    uStack_28078._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = (undefined4)in_FPUInstructionPointer;
    uStack_28070 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_28078._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_2_ = in_FPUTagWord;
    uStack_28088 = (*(this->super_ObmcSadHBDTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.tst_func)
                             ((uchar *)((ulong)auStack_28060 >> 1),iVar4,aiStack_10060,aiStack_20060
                             );
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)aiStack_28080);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_28080,"ref_res","tst_res",&uStack_28084,&uStack_28088);
    if (aiStack_28080[0] == (internal)0x0) {
      testing::Message::Message((Message *)&_Stack_28090);
      puVar1 = (undefined8 *)
               CONCAT44(uStack_28078._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,
                        CONCAT22(uStack_28078._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._2_2_,
                                 uStack_28078._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_2_));
      if (puVar1 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_28098,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_sad_test.cc"
                 ,0xeb,(char *)message);
      testing::internal::AssertHelper::operator=(&AStack_28098,(Message *)&_Stack_28090);
      testing::internal::AssertHelper::~AssertHelper(&AStack_28098);
      if (_Stack_28090._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)_Stack_28090._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&uStack_28078);
      return;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&uStack_28078);
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

TEST_P(ObmcSadHBDTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint16_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = (1 << 12) - 1;
      wsrc[i] = ((1 << 12) - 1) * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res =
        params_.ref_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(
        tst_res =
            params_.tst_func(CONVERT_TO_BYTEPTR(pre), pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}